

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void transaction_test(void)

{
  void *pvVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  fdb_kvs_handle *handle;
  fdb_kvs_handle *pfVar7;
  fdb_doc *pfVar8;
  ulong uVar9;
  char *pcVar10;
  fdb_kvs_handle *pfVar11;
  fdb_kvs_handle *pfVar12;
  uint uVar13;
  fdb_doc *unaff_RBP;
  fdb_doc *unaff_R12;
  long lVar14;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_config *config;
  char *pcVar15;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_kvs_handle *db_txn1;
  fdb_file_handle *dbfile_txn1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db_txn2;
  fdb_file_handle *dbfile_txn2;
  fdb_file_handle *dbfile_txn3;
  fdb_kvs_handle *db_txn3;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  char keybuf [256];
  timeval __test_begin;
  char metabuf [256];
  fdb_config fconfig;
  fdb_iterator *pfStack_af0;
  fdb_doc *pfStack_ae8;
  fdb_kvs_handle *pfStack_ae0;
  timeval tStack_ad8;
  char acStack_ac8 [256];
  char acStack_9c8 [264];
  fdb_kvs_handle *pfStack_8c0;
  fdb_doc *pfStack_8b8;
  fdb_kvs_handle *pfStack_8b0;
  fdb_kvs_config *pfStack_8a8;
  fdb_kvs_handle *pfStack_8a0;
  fdb_doc *pfStack_898;
  fdb_kvs_handle *pfStack_888;
  undefined1 auStack_880 [16];
  fdb_kvs_handle *pfStack_870;
  fdb_kvs_handle *pfStack_868;
  fdb_file_handle *pfStack_860;
  hbtrie *phStack_858;
  btree *pbStack_850;
  fdb_kvs_config fStack_848;
  timeval tStack_830;
  undefined1 auStack_820 [512];
  fdb_config fStack_620;
  fdb_doc *pfStack_528;
  fdb_doc *pfStack_520;
  fdb_kvs_handle *pfStack_518;
  fdb_kvs_handle *pfStack_510;
  fdb_kvs_handle *pfStack_508;
  fdb_doc *pfStack_500;
  undefined1 local_4e8 [16];
  fdb_kvs_handle *local_4d8;
  fdb_file_handle *local_4d0;
  undefined1 local_4c8 [40];
  undefined1 local_4a0 [24];
  undefined1 local_488 [256];
  fdb_doc fStack_388;
  undefined1 local_338 [272];
  fdb_doc local_228 [3];
  fdb_config local_128;
  
  pfStack_500 = (fdb_doc *)0x116e1d;
  gettimeofday((timeval *)(local_338 + 0x100),(__timezone_ptr_t)0x0);
  pfStack_500 = (fdb_doc *)0x116e22;
  memleak_start();
  pfStack_500 = (fdb_doc *)0x116e2e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_500 = (fdb_doc *)0x116e3e;
  fdb_get_default_config();
  pfVar11 = (fdb_kvs_handle *)local_4a0;
  pfStack_500 = (fdb_doc *)0x116e4b;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.purging_interval = 0;
  local_128.compaction_threshold = '\0';
  pfVar7 = (fdb_kvs_handle *)local_4c8;
  pfStack_500 = (fdb_doc *)0x116e84;
  fdb_open((fdb_file_handle **)pfVar7,"mvcc_test1",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x116e97;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,(fdb_kvs_config *)pfVar11
            );
  pfStack_500 = (fdb_doc *)0x116ead;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e41;
  pfStack_500 = (fdb_doc *)0x116ed7;
  fdb_open(&local_4d0,"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x116eea;
  fdb_open((fdb_file_handle **)(local_4c8 + 0x10),"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x116eff;
  fdb_kvs_open_default(local_4d0,&local_4d8,(fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x116f10;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._16_8_,(fdb_kvs_handle **)(local_4c8 + 8),
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x116f1d;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x116f2b;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._16_8_,'\x02');
  lVar14 = 0;
  uVar9 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x116f4b;
    sprintf(local_338,"key%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x116f63;
    sprintf((char *)local_228,"meta%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x116f78;
    sprintf(local_488,"body%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x116f8b;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x116f9e;
    sVar5 = strlen((char *)local_228);
    pfStack_500 = (fdb_doc *)0x116fab;
    sVar6 = strlen(local_488);
    pfStack_500 = (fdb_doc *)0x116fcd;
    fdb_doc_create((fdb_doc **)((long)&fStack_388.keylen + lVar14),local_338,sVar4,local_228,sVar5,
                   local_488,sVar6);
    pfStack_500 = (fdb_doc *)0x116fdf;
    fdb_set(local_4d8,(fdb_doc *)(&fStack_388.keylen)[uVar9]);
    uVar9 = uVar9 + 1;
    lVar14 = lVar14 + 8;
  } while (uVar9 != 5);
  uVar9 = 5;
  unaff_R13 = (fdb_kvs_handle *)0x28;
  do {
    pfStack_500 = (fdb_doc *)0x117016;
    sprintf(local_338,"key%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x11702e;
    sprintf((char *)local_228,"meta%d",uVar9 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x117043;
    sprintf(local_488,"body%d",uVar9 & 0xffffffff);
    unaff_R12 = (fdb_doc *)((long)unaff_R13 + (long)&fStack_388.keylen);
    pfStack_500 = (fdb_doc *)0x117056;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117069;
    sVar5 = strlen((char *)local_228);
    pfStack_500 = (fdb_doc *)0x117076;
    sVar6 = strlen(local_488);
    pfStack_500 = (fdb_doc *)0x117098;
    fdb_doc_create((fdb_doc **)unaff_R12,local_338,sVar4,local_228,sVar5,local_488,sVar6);
    pfStack_500 = (fdb_doc *)0x1170aa;
    fdb_set((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)(&fStack_388.keylen)[uVar9]);
    uVar9 = uVar9 + 1;
    unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
  } while (uVar9 != 10);
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1170e0;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1170e8;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117106;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117115;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e23;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117e28;
    pfStack_500 = (fdb_doc *)0x117135;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117158;
  fdb_open((fdb_file_handle **)(local_4c8 + 0x18),"mvcc_test1",&local_128);
  pfStack_500 = (fdb_doc *)0x11716a;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._24_8_,(fdb_kvs_handle **)(local_4c8 + 0x20),
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x117177;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._24_8_,'\x03');
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x11719c;
    sprintf(local_338,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1171a4;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x1171c2;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1171d1;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._32_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_500 = (fdb_doc *)0x117d8b;
      transaction_test();
      goto LAB_00117d8b;
    }
    pfStack_500 = (fdb_doc *)0x1171e3;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x1171f6;
  fdb_end_transaction((fdb_file_handle *)local_4c8._24_8_,'\0');
  pfStack_500 = (fdb_doc *)0x117200;
  fdb_close((fdb_file_handle *)local_4c8._24_8_);
  pfStack_500 = (fdb_doc *)0x11720c;
  fdb_end_transaction(local_4d0,'\0');
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117231;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117239;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117257;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117266;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e2d;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117e32;
    pfStack_500 = (fdb_doc *)0x117286;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1172b2;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1172ba;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x1172d8;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1172e7;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117d8b;
    pfStack_500 = (fdb_doc *)0x1172f9;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x11730a;
  fdb_abort_transaction((fdb_file_handle *)local_4c8._16_8_);
  pfStack_500 = (fdb_doc *)0x117317;
  fdb_close((fdb_file_handle *)local_4c8._0_8_);
  pfStack_500 = (fdb_doc *)0x11732e;
  fdb_open((fdb_file_handle **)local_4c8,"mvcc_test1",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x117343;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x117359;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e46;
  pcVar10 = "key%d";
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117386;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x11738e;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x1173ac;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1173bb;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if ((uint)unaff_RBP < 5) {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e37;
    }
    else if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00117e3c;
    pfStack_500 = (fdb_doc *)0x1173db;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (uint)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  lVar14 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x1173f6;
    fdb_set((fdb_kvs_handle *)local_4e8._8_8_,*(fdb_doc **)(local_338 + lVar14 * 8 + -0x28));
    lVar14 = lVar14 + 1;
  } while (lVar14 != 5);
  pfStack_500 = (fdb_doc *)0x11740b;
  fdb_commit((fdb_file_handle *)local_4c8._0_8_,'\0');
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117430;
    sprintf(local_338,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x117438;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117456;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117465;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117d90;
    pfStack_500 = (fdb_doc *)0x117477;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x11748d;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x11749c;
  fdb_begin_transaction((fdb_file_handle *)local_4c8._16_8_,'\x02');
  uVar9 = 0;
  do {
    pfStack_500 = (fdb_doc *)0x1174bb;
    sprintf(local_338,"key%d",uVar9);
    unaff_RBP = local_228;
    pfStack_500 = (fdb_doc *)0x1174d7;
    sprintf((char *)unaff_RBP,"meta%d",uVar9);
    pcVar15 = local_488;
    pfStack_500 = (fdb_doc *)0x1174f0;
    sprintf(pcVar15,"body%d_txn1",uVar9);
    pfStack_500 = (fdb_doc *)0x1174f8;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117503;
    sVar5 = strlen((char *)unaff_RBP);
    pfStack_500 = (fdb_doc *)0x11750e;
    sVar6 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x117533;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,unaff_RBP,sVar5,pcVar15,sVar6);
    pfStack_500 = (fdb_doc *)0x117542;
    fdb_set(local_4d8,(fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x11754c;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x117560;
    sprintf(pcVar15,"body%d_txn2",uVar9);
    pfStack_500 = (fdb_doc *)0x117568;
    sVar4 = strlen(local_338);
    pfStack_500 = (fdb_doc *)0x117573;
    sVar5 = strlen((char *)unaff_RBP);
    pfStack_500 = (fdb_doc *)0x11757e;
    sVar6 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x11759b;
    fdb_doc_create((fdb_doc **)local_4e8,local_338,sVar4,unaff_RBP,sVar5,pcVar15,sVar6);
    pfStack_500 = (fdb_doc *)0x1175aa;
    fdb_set((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    pfStack_500 = (fdb_doc *)0x1175b4;
    fdb_doc_free((fdb_doc *)local_4e8._0_8_);
    uVar13 = (int)uVar9 + 1;
    uVar9 = (ulong)uVar13;
  } while (uVar13 != 10);
  unaff_R13 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar10 = (char *)0x0;
  do {
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfStack_500 = (fdb_doc *)0x1175e8;
    sprintf((char *)pfVar11,"key%d",(ulong)pcVar10 & 0xffffffff);
    pfStack_500 = (fdb_doc *)0x1175f0;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x11760e;
    fdb_doc_create((fdb_doc **)unaff_R13,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x11761d;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    unaff_R12 = (fdb_doc *)local_4e8._0_8_;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117da0;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfVar7 = *(fdb_kvs_handle **)((&fStack_388.keylen)[(long)pcVar10] + 0x40);
    pfStack_500 = (fdb_doc *)0x117651;
    iVar3 = bcmp(unaff_RBP,pfVar7,*(size_t *)(local_4e8._0_8_ + 0x10));
    pfVar11 = handle;
    if (iVar3 != 0) goto LAB_00117d95;
    pfStack_500 = (fdb_doc *)0x117661;
    fdb_doc_free(unaff_R12);
    pcVar15 = local_338;
    pfStack_500 = (fdb_doc *)0x117671;
    sVar4 = strlen(pcVar15);
    pfStack_500 = (fdb_doc *)0x117692;
    fdb_doc_create((fdb_doc **)unaff_R13,pcVar15,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1176a1;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    pfVar7 = unaff_R13;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117db2;
    pfStack_500 = (fdb_doc *)0x1176bf;
    sprintf((char *)handle,"body%d_txn1",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x1176d9;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117da5;
    pfStack_500 = (fdb_doc *)0x1176e9;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfStack_500 = (fdb_doc *)0x1176f9;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117717;
    fdb_doc_create((fdb_doc **)unaff_R13,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117726;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4c8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117dc4;
    pfStack_500 = (fdb_doc *)0x117741;
    sprintf((char *)handle,"body%d_txn2",(ulong)pcVar10 & 0xffffffff);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x11775b;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117db7;
    pfStack_500 = (fdb_doc *)0x11776b;
    fdb_doc_free((fdb_doc *)pcVar15);
    pcVar10 = (char *)((long)&((fdb_doc *)pcVar10)->keylen + 1);
  } while ((fdb_doc *)pcVar10 != (fdb_doc *)0xa);
  pfStack_500 = (fdb_doc *)0x117784;
  fdb_end_transaction((fdb_file_handle *)local_4c8._16_8_,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar10 = (char *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1177ab;
    sprintf((char *)pfVar11,"key%d",pcVar10);
    pfStack_500 = (fdb_doc *)0x1177b3;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x1177d1;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x1177e0;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117dd6;
    pfStack_500 = (fdb_doc *)0x1177fb;
    sprintf((char *)handle,"body%d_txn2",pcVar10);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117815;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117dc9;
    pfStack_500 = (fdb_doc *)0x117825;
    fdb_doc_free((fdb_doc *)pcVar15);
    pfStack_500 = (fdb_doc *)0x11782d;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x11784b;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x11785a;
    fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117de8;
    pfStack_500 = (fdb_doc *)0x117875;
    sprintf((char *)handle,"body%d_txn1",pcVar10);
    pcVar15 = (char *)local_4e8._0_8_;
    unaff_RBP = *(fdb_doc **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x11788f;
    iVar3 = bcmp(unaff_RBP,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117ddb;
    pfStack_500 = (fdb_doc *)0x11789f;
    fdb_doc_free((fdb_doc *)pcVar15);
    uVar13 = (int)pcVar10 + 1;
    pcVar10 = (char *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x1178b6;
  fdb_end_transaction(local_4d0,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pcVar15 = "body%d_txn1";
  handle = (fdb_kvs_handle *)local_488;
  unaff_RBP = (fdb_doc *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x1178df;
    sprintf((char *)pfVar11,"key%d",unaff_RBP);
    pfStack_500 = (fdb_doc *)0x1178e7;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117907;
    fdb_doc_create((fdb_doc **)local_4e8,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117916;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117dfa;
    pfStack_500 = (fdb_doc *)0x11792d;
    sprintf((char *)handle,"body%d_txn1",unaff_RBP);
    pcVar10 = (char *)local_4e8._0_8_;
    pfVar7 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117945;
    iVar3 = bcmp(pfVar7,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117ded;
    pfStack_500 = (fdb_doc *)0x117955;
    fdb_doc_free((fdb_doc *)pcVar10);
    uVar13 = (int)unaff_RBP + 1;
    unaff_RBP = (fdb_doc *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x11796f;
  fdb_begin_transaction(local_4d0,'\x02');
  pfStack_500 = (fdb_doc *)0x11798d;
  sprintf((char *)local_338,"key%d",5);
  pfVar7 = (fdb_kvs_handle *)local_228;
  pfStack_500 = (fdb_doc *)0x1179ab;
  sprintf((char *)pfVar7,"meta%d",5);
  pcVar15 = local_488;
  pfStack_500 = (fdb_doc *)0x1179c6;
  sprintf(pcVar15,"body%d_before_compaction",5);
  pfStack_500 = (fdb_doc *)0x1179ce;
  handle = (fdb_kvs_handle *)strlen((char *)local_338);
  pfStack_500 = (fdb_doc *)0x1179d9;
  unaff_RBP = (fdb_doc *)strlen((char *)pfVar7);
  pfStack_500 = (fdb_doc *)0x1179e4;
  sVar4 = strlen(pcVar15);
  pfVar11 = (fdb_kvs_handle *)local_4e8;
  pfStack_500 = (fdb_doc *)0x117a04;
  fdb_doc_create((fdb_doc **)pfVar11,(fdb_doc *)local_338,(size_t)handle,pfVar7,(size_t)unaff_RBP,
                 pcVar15,sVar4);
  pfStack_500 = (fdb_doc *)0x117a11;
  fdb_set(local_4d8,(fdb_doc *)local_4e8._0_8_);
  pfStack_500 = (fdb_doc *)0x117a19;
  fdb_doc_free((fdb_doc *)local_4e8._0_8_);
  pfStack_500 = (fdb_doc *)0x117a2a;
  fdb_compact((fdb_file_handle *)local_4c8._0_8_,"mvcc_test2");
  pfStack_500 = (fdb_doc *)0x117a32;
  sVar4 = strlen((char *)local_338);
  pfStack_500 = (fdb_doc *)0x117a50;
  fdb_doc_create((fdb_doc **)pfVar11,(fdb_doc *)local_338,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_500 = (fdb_doc *)0x117a5d;
  fVar2 = fdb_get(local_4d8,(fdb_doc *)local_4e8._0_8_);
  pcVar10 = (char *)local_4e8._0_8_;
  pfVar8 = (fdb_doc *)local_338;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e4b;
  pfVar11 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
  pfStack_500 = (fdb_doc *)0x117a7f;
  iVar3 = bcmp(pfVar11,local_488,*(size_t *)(local_4e8._0_8_ + 0x10));
  if (iVar3 != 0) goto LAB_00117e50;
  pfStack_500 = (fdb_doc *)0x117a8f;
  fdb_doc_free((fdb_doc *)pcVar10);
  pcVar10 = local_338;
  pfStack_500 = (fdb_doc *)0x117a9f;
  sVar4 = strlen(pcVar10);
  pfVar11 = (fdb_kvs_handle *)local_4e8;
  pfStack_500 = (fdb_doc *)0x117ac2;
  fdb_doc_create((fdb_doc **)pfVar11,pcVar10,sVar4,(void *)0x0,0,(void *)0x0,0);
  pfStack_500 = (fdb_doc *)0x117acf;
  fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e5d;
  pfVar7 = (fdb_kvs_handle *)local_488;
  pfStack_500 = (fdb_doc *)0x117af2;
  sprintf((char *)pfVar7,"body%d_txn1",5);
  pcVar10 = (char *)local_4e8._0_8_;
  pfVar11 = *(fdb_kvs_handle **)(local_4e8._0_8_ + 0x40);
  pfStack_500 = (fdb_doc *)0x117b0a;
  iVar3 = bcmp(pfVar11,pfVar7,*(size_t *)(local_4e8._0_8_ + 0x10));
  if (iVar3 != 0) goto LAB_00117e62;
  pfStack_500 = (fdb_doc *)0x117b1a;
  fdb_doc_free((fdb_doc *)pcVar10);
  pfStack_500 = (fdb_doc *)0x117b26;
  fdb_end_transaction(local_4d0,'\0');
  pfVar11 = (fdb_kvs_handle *)local_338;
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  handle = (fdb_kvs_handle *)local_488;
  pcVar15 = (char *)0x0;
  do {
    pfStack_500 = (fdb_doc *)0x117b4f;
    sprintf((char *)pfVar11,"key%d",pcVar15);
    pfStack_500 = (fdb_doc *)0x117b57;
    sVar4 = strlen((char *)pfVar11);
    pfStack_500 = (fdb_doc *)0x117b75;
    fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
    pfStack_500 = (fdb_doc *)0x117b84;
    fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00117e0c;
    if ((int)pcVar15 == 5) {
      pcVar10 = "body%d_before_compaction";
      pfVar8 = (fdb_doc *)0x5;
    }
    else {
      pcVar10 = "body%d_txn1";
      pfVar8 = (fdb_doc *)pcVar15;
    }
    pfStack_500 = (fdb_doc *)0x117bb4;
    sprintf((char *)handle,pcVar10,pfVar8);
    unaff_RBP = (fdb_doc *)local_4e8._0_8_;
    pcVar10 = *(char **)(local_4e8._0_8_ + 0x40);
    pfStack_500 = (fdb_doc *)0x117bcc;
    iVar3 = bcmp(pcVar10,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
    if (iVar3 != 0) goto LAB_00117dff;
    pfStack_500 = (fdb_doc *)0x117bdc;
    fdb_doc_free(unaff_RBP);
    uVar13 = (int)pcVar15 + 1;
    pcVar15 = (char *)(ulong)uVar13;
  } while (uVar13 != 10);
  pfStack_500 = (fdb_doc *)0x117bf6;
  fdb_close((fdb_file_handle *)local_4c8._0_8_);
  pfStack_500 = (fdb_doc *)0x117c0d;
  fdb_open((fdb_file_handle **)local_4c8,"mvcc_test2",&local_128);
  pcVar10 = local_4e8 + 8;
  pfStack_500 = (fdb_doc *)0x117c22;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_4c8._0_8_,(fdb_kvs_handle **)pcVar10,
             (fdb_kvs_config *)local_4a0);
  pfStack_500 = (fdb_doc *)0x117c38;
  fVar2 = fdb_set_log_callback((fdb_kvs_handle *)local_4e8._8_8_,logCallbackFunc,"transaction_test")
  ;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)local_338;
    pfVar7 = (fdb_kvs_handle *)local_4e8;
    handle = (fdb_kvs_handle *)local_488;
    pcVar15 = (char *)0x0;
    while( true ) {
      pfStack_500 = (fdb_doc *)0x117c69;
      sprintf((char *)pfVar11,"key%d",pcVar15);
      pfStack_500 = (fdb_doc *)0x117c71;
      sVar4 = strlen((char *)pfVar11);
      pfStack_500 = (fdb_doc *)0x117c8f;
      fdb_doc_create((fdb_doc **)pfVar7,pfVar11,sVar4,(void *)0x0,0,(void *)0x0,0);
      pfStack_500 = (fdb_doc *)0x117c9e;
      fVar2 = fdb_get((fdb_kvs_handle *)local_4e8._8_8_,(fdb_doc *)local_4e8._0_8_);
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      if ((int)pcVar15 == 5) {
        pcVar10 = "body%d_before_compaction";
        pfVar8 = (fdb_doc *)0x5;
      }
      else {
        pcVar10 = "body%d_txn1";
        pfVar8 = (fdb_doc *)pcVar15;
      }
      pfStack_500 = (fdb_doc *)0x117cce;
      sprintf((char *)handle,pcVar10,pfVar8);
      unaff_RBP = (fdb_doc *)local_4e8._0_8_;
      pcVar10 = *(char **)(local_4e8._0_8_ + 0x40);
      pfStack_500 = (fdb_doc *)0x117ce6;
      iVar3 = bcmp(pcVar10,handle,*(size_t *)(local_4e8._0_8_ + 0x10));
      if (iVar3 != 0) goto LAB_00117e11;
      pfStack_500 = (fdb_doc *)0x117cf6;
      fdb_doc_free(unaff_RBP);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
      if (uVar13 == 10) {
        pfStack_500 = (fdb_doc *)0x117d0d;
        fdb_close((fdb_file_handle *)local_4c8._0_8_);
        pfStack_500 = (fdb_doc *)0x117d17;
        fdb_close(local_4d0);
        pfStack_500 = (fdb_doc *)0x117d21;
        fdb_close((fdb_file_handle *)local_4c8._16_8_);
        lVar14 = 0;
        do {
          pfStack_500 = (fdb_doc *)0x117d30;
          fdb_doc_free((fdb_doc *)(&fStack_388.keylen)[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 10);
        pfStack_500 = (fdb_doc *)0x117d3e;
        fdb_shutdown();
        pfStack_500 = (fdb_doc *)0x117d43;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_500 = (fdb_doc *)0x117d74;
        fprintf(_stderr,pcVar10,"transaction test");
        return;
      }
    }
    goto LAB_00117e1e;
  }
  goto LAB_00117e6f;
LAB_0011849b:
  pfStack_898 = (fdb_doc *)0x1184a8;
  transaction_simple_api_test();
  pfVar11 = pfVar7;
LAB_001184a8:
  pfStack_898 = (fdb_doc *)0x1184ad;
  transaction_simple_api_test();
LAB_001184ad:
  pfStack_898 = (fdb_doc *)0x1184ba;
  transaction_simple_api_test();
  pfVar7 = pfVar11;
LAB_001184ba:
  pfStack_898 = (fdb_doc *)0x1184bf;
  transaction_simple_api_test();
LAB_001184bf:
  pfStack_898 = (fdb_doc *)0x1184cc;
  transaction_simple_api_test();
  pfVar12 = pfVar7;
LAB_001184cc:
  pfStack_898 = (fdb_doc *)0x1184d1;
  transaction_simple_api_test();
LAB_001184d1:
  pfStack_898 = (fdb_doc *)0x1184de;
  transaction_simple_api_test();
  pfVar7 = pfVar12;
LAB_001184de:
  pfVar12 = pfVar7;
  pfStack_898 = (fdb_doc *)0x1184e3;
  transaction_simple_api_test();
LAB_001184e3:
  pfStack_898 = (fdb_doc *)0x1184e8;
  transaction_simple_api_test();
LAB_001184e8:
  pfVar11 = pfVar12;
  pfStack_898 = (fdb_doc *)0x1184ed;
  transaction_simple_api_test();
LAB_001184ed:
  pfStack_898 = (fdb_doc *)0x1184fa;
  transaction_simple_api_test();
LAB_001184fa:
  pfVar12 = (fdb_kvs_handle *)auStack_820;
  pfStack_898 = (fdb_doc *)0x118507;
  transaction_simple_api_test();
  pfVar7 = (fdb_kvs_handle *)pcVar15;
  goto LAB_00118507;
LAB_00117d8b:
  pfStack_500 = (fdb_doc *)0x117d90;
  transaction_test();
LAB_00117d90:
  pfVar7 = (fdb_kvs_handle *)local_4e8;
  pfVar11 = (fdb_kvs_handle *)local_338;
  pcVar10 = "key%d";
  pfStack_500 = (fdb_doc *)0x117d95;
  transaction_test();
LAB_00117d95:
  pfStack_500 = (fdb_doc *)0x117da0;
  transaction_test();
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
  unaff_R13 = pfVar7;
LAB_00117da0:
  pfStack_500 = (fdb_doc *)0x117da5;
  transaction_test();
LAB_00117da5:
  pfStack_500 = (fdb_doc *)0x117db2;
  transaction_test();
  pfVar7 = handle;
LAB_00117db2:
  handle = pfVar7;
  pfStack_500 = (fdb_doc *)0x117db7;
  transaction_test();
  pfVar7 = unaff_R13;
LAB_00117db7:
  pfStack_500 = (fdb_doc *)0x117dc4;
  transaction_test();
LAB_00117dc4:
  pfStack_500 = (fdb_doc *)0x117dc9;
  transaction_test();
LAB_00117dc9:
  pfStack_500 = (fdb_doc *)0x117dd6;
  transaction_test();
LAB_00117dd6:
  pfStack_500 = (fdb_doc *)0x117ddb;
  transaction_test();
LAB_00117ddb:
  pfStack_500 = (fdb_doc *)0x117de8;
  transaction_test();
LAB_00117de8:
  pfStack_500 = (fdb_doc *)0x117ded;
  transaction_test();
LAB_00117ded:
  pfStack_500 = (fdb_doc *)0x117dfa;
  transaction_test();
LAB_00117dfa:
  pfStack_500 = (fdb_doc *)0x117dff;
  transaction_test();
LAB_00117dff:
  pfStack_500 = (fdb_doc *)0x117e0c;
  transaction_test();
LAB_00117e0c:
  pfStack_500 = (fdb_doc *)0x117e11;
  transaction_test();
LAB_00117e11:
  pfStack_500 = (fdb_doc *)0x117e1e;
  transaction_test();
LAB_00117e1e:
  pfStack_500 = (fdb_doc *)0x117e23;
  transaction_test();
  unaff_R12 = (fdb_doc *)pcVar15;
  unaff_R13 = handle;
LAB_00117e23:
  pfStack_500 = (fdb_doc *)0x117e28;
  transaction_test();
LAB_00117e28:
  pfStack_500 = (fdb_doc *)0x117e2d;
  transaction_test();
LAB_00117e2d:
  pfStack_500 = (fdb_doc *)0x117e32;
  transaction_test();
LAB_00117e32:
  pfStack_500 = (fdb_doc *)0x117e37;
  transaction_test();
LAB_00117e37:
  pfStack_500 = (fdb_doc *)0x117e3c;
  transaction_test();
LAB_00117e3c:
  pfStack_500 = (fdb_doc *)0x117e41;
  transaction_test();
LAB_00117e41:
  pfStack_500 = (fdb_doc *)0x117e46;
  transaction_test();
  pcVar15 = (char *)unaff_R12;
  handle = unaff_R13;
LAB_00117e46:
  pfStack_500 = (fdb_doc *)0x117e4b;
  transaction_test();
  pfVar8 = (fdb_doc *)pcVar10;
LAB_00117e4b:
  pcVar10 = (char *)pfVar8;
  pfStack_500 = (fdb_doc *)0x117e50;
  transaction_test();
LAB_00117e50:
  pfStack_500 = (fdb_doc *)0x117e5d;
  transaction_test();
LAB_00117e5d:
  pfStack_500 = (fdb_doc *)0x117e62;
  transaction_test();
LAB_00117e62:
  pfStack_500 = (fdb_doc *)0x117e6f;
  transaction_test();
LAB_00117e6f:
  pfStack_500 = (fdb_doc *)transaction_simple_api_test;
  transaction_test();
  pfStack_898 = (fdb_doc *)0x117e91;
  pfStack_528 = (fdb_doc *)pcVar10;
  pfStack_520 = (fdb_doc *)pcVar15;
  pfStack_518 = handle;
  pfStack_510 = pfVar11;
  pfStack_508 = pfVar7;
  pfStack_500 = unaff_RBP;
  gettimeofday(&tStack_830,(__timezone_ptr_t)0x0);
  pfStack_898 = (fdb_doc *)0x117e96;
  memleak_start();
  pfStack_898 = (fdb_doc *)0x117ea2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_898 = (fdb_doc *)0x117eb2;
  fdb_get_default_config();
  config = &fStack_848;
  pfStack_898 = (fdb_doc *)0x117ebf;
  fdb_get_default_kvs_config();
  fStack_620.buffercache_size = 0;
  fStack_620.wal_threshold = 0x400;
  fStack_620.flags = 1;
  fStack_620.purging_interval = 0;
  fStack_620.compaction_threshold = '\0';
  pfVar7 = (fdb_kvs_handle *)&pbStack_850;
  pfStack_898 = (fdb_doc *)0x117ef8;
  fdb_open((fdb_file_handle **)pfVar7,"./mvcc_test1",&fStack_620);
  pfVar11 = (fdb_kvs_handle *)(auStack_880 + 8);
  pfStack_898 = (fdb_doc *)0x117f0b;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_850,(fdb_kvs_handle **)pfVar11,config);
  pfStack_898 = (fdb_doc *)0x117f21;
  pfVar12 = (fdb_kvs_handle *)auStack_880._8_8_;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_880._8_8_,logCallbackFunc,
                     "transaction_simple_api_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar10 = auStack_820 + 0x100;
    pcVar15 = "body%d";
    unaff_RBP = (fdb_doc *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x117f52;
      sprintf(pcVar10,"key%d",unaff_RBP);
      pfStack_898 = (fdb_doc *)0x117f61;
      sprintf(auStack_820,"body%d",unaff_RBP);
      handle = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x117f6e;
      pfVar7 = (fdb_kvs_handle *)strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x117f79;
      sVar4 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x117f8d;
      fVar2 = fdb_set_kv(handle,pcVar10,(size_t)pfVar7,auStack_820,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_898 = (fdb_doc *)0x11849b;
        transaction_simple_api_test();
        goto LAB_0011849b;
      }
      uVar13 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_doc *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x117fa8;
    fdb_commit((fdb_file_handle *)pbStack_850,'\0');
    pfStack_898 = (fdb_doc *)0x117fca;
    fdb_open((fdb_file_handle **)&phStack_858,"./mvcc_test1",&fStack_620);
    pfStack_898 = (fdb_doc *)0x117fdd;
    fdb_open(&pfStack_860,"./mvcc_test1",&fStack_620);
    pfStack_898 = (fdb_doc *)0x117ff2;
    fdb_kvs_open_default((fdb_file_handle *)phStack_858,&pfStack_868,&fStack_848);
    pfStack_898 = (fdb_doc *)0x118003;
    fdb_kvs_open_default(pfStack_860,&pfStack_870,&fStack_848);
    pfStack_898 = (fdb_doc *)0x118010;
    fdb_begin_transaction((fdb_file_handle *)phStack_858,'\x02');
    pfStack_898 = (fdb_doc *)0x11801e;
    fdb_begin_transaction(pfStack_860,'\x02');
    pcVar10 = auStack_820 + 0x100;
    uVar13 = 0;
    do {
      pfStack_898 = (fdb_doc *)0x118043;
      sprintf(pcVar10,"key%d",(ulong)uVar13);
      pfStack_898 = (fdb_doc *)0x118056;
      sprintf(auStack_820,"body%d_txn1",(ulong)uVar13);
      pfVar7 = pfStack_868;
      pfStack_898 = (fdb_doc *)0x118063;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11806e;
      sVar5 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x118082;
      fdb_set_kv(pfVar7,pcVar10,sVar4,auStack_820,sVar5);
      pfStack_898 = (fdb_doc *)0x118091;
      sprintf(pcVar10,"key%d",(ulong)uVar13);
      pfStack_898 = (fdb_doc *)0x1180a4;
      sprintf(auStack_820,"body%d_txn2",(ulong)uVar13);
      pfVar7 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x1180b1;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1180bc;
      sVar5 = strlen(auStack_820);
      pfStack_898 = (fdb_doc *)0x1180d0;
      fdb_set_kv(pfVar7,pcVar10,sVar4,auStack_820,sVar5);
      uVar13 = uVar13 + 1;
    } while (uVar13 != 10);
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pcVar15 = (char *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x118109;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x11811d;
      sprintf(auStack_820,"body%d",pcVar15);
      pfVar11 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x11812a;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11813e;
      fVar2 = fdb_get_kv(pfVar11,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar7 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184a8;
      pfStack_898 = (fdb_doc *)0x11815b;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_0011849b;
      pfStack_898 = (fdb_doc *)0x11816b;
      fdb_free_block(pfVar7);
      pfStack_898 = (fdb_doc *)0x11817f;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x118193;
      sprintf(auStack_820,"body%d_txn1",pcVar15);
      pfVar7 = pfStack_868;
      pfStack_898 = (fdb_doc *)0x1181a0;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1181b4;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar11 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184ba;
      pfStack_898 = (fdb_doc *)0x1181d1;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001184ad;
      pfStack_898 = (fdb_doc *)0x1181e1;
      fdb_free_block(pfVar11);
      pfStack_898 = (fdb_doc *)0x1181f5;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x118209;
      sprintf(auStack_820,"body%d_txn2",pcVar15);
      pfVar12 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x118216;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x11822a;
      fVar2 = fdb_get_kv(pfVar12,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar7 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184cc;
      pfStack_898 = (fdb_doc *)0x118247;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001184bf;
      pfStack_898 = (fdb_doc *)0x118257;
      fdb_free_block(pfVar7);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x118270;
    fdb_end_transaction((fdb_file_handle *)phStack_858,'\0');
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pcVar15 = (char *)0x0;
    do {
      pfStack_898 = (fdb_doc *)0x11829e;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x1182b2;
      sprintf(auStack_820,"body%d_txn1",pcVar15);
      pfVar7 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x1182bf;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1182d3;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar12 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184de;
      pfStack_898 = (fdb_doc *)0x1182f0;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001184d1;
      pfStack_898 = (fdb_doc *)0x118300;
      fVar2 = fdb_free_block(pfVar12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184e3;
      pfStack_898 = (fdb_doc *)0x11831c;
      sprintf(pcVar10,"key%d",pcVar15);
      pfStack_898 = (fdb_doc *)0x118330;
      sprintf(auStack_820,"body%d_txn2",pcVar15);
      pfVar12 = pfStack_870;
      pfStack_898 = (fdb_doc *)0x11833d;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x118351;
      fVar2 = fdb_get_kv(pfVar12,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pfVar11 = pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001184e8;
      pfStack_898 = (fdb_doc *)0x11836e;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001184ed;
      pfStack_898 = (fdb_doc *)0x11837e;
      fdb_free_block(pfVar11);
      uVar13 = (int)pcVar15 + 1;
      pcVar15 = (char *)(ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_898 = (fdb_doc *)0x118397;
    fdb_end_transaction(pfStack_860,'\0');
    pcVar10 = auStack_820 + 0x100;
    handle = (fdb_kvs_handle *)&pfStack_888;
    unaff_RBP = (fdb_doc *)auStack_880;
    pfVar11 = (fdb_kvs_handle *)0x0;
    while( true ) {
      pfStack_898 = (fdb_doc *)0x1183c3;
      sprintf(pcVar10,"key%d",pfVar11);
      pfStack_898 = (fdb_doc *)0x1183d6;
      sprintf(auStack_820,"body%d_txn2",pfVar11);
      pfVar7 = (fdb_kvs_handle *)auStack_880._8_8_;
      pfStack_898 = (fdb_doc *)0x1183e3;
      sVar4 = strlen(pcVar10);
      pfStack_898 = (fdb_doc *)0x1183f7;
      pfVar12 = pfVar7;
      fVar2 = fdb_get_kv(pfVar7,pcVar10,sVar4,(void **)handle,(size_t *)unaff_RBP);
      pcVar15 = (char *)pfStack_888;
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      pfStack_898 = (fdb_doc *)0x118414;
      iVar3 = bcmp(pfStack_888,auStack_820,auStack_880._0_8_);
      if (iVar3 != 0) goto LAB_001184fa;
      pfStack_898 = (fdb_doc *)0x118424;
      fdb_free_block(pcVar15);
      uVar13 = (int)pfVar11 + 1;
      pfVar11 = (fdb_kvs_handle *)(ulong)uVar13;
      if (uVar13 == 10) {
        pfStack_898 = (fdb_doc *)0x118435;
        fdb_close((fdb_file_handle *)pbStack_850);
        pfStack_898 = (fdb_doc *)0x11843f;
        fdb_close((fdb_file_handle *)phStack_858);
        pfStack_898 = (fdb_doc *)0x118449;
        fdb_close(pfStack_860);
        pfStack_898 = (fdb_doc *)0x11844e;
        fdb_shutdown();
        pfStack_898 = (fdb_doc *)0x118453;
        memleak_end();
        pcVar10 = "%s PASSED\n";
        if (transaction_simple_api_test()::__test_pass != '\0') {
          pcVar10 = "%s FAILED\n";
        }
        pfStack_898 = (fdb_doc *)0x118484;
        fprintf(_stderr,pcVar10,"transaction simple API test");
        return;
      }
    }
LAB_00118507:
    config = (fdb_kvs_config *)(auStack_820 + 0x100);
    pcVar15 = auStack_820;
    pfStack_898 = (fdb_doc *)0x11850c;
    transaction_simple_api_test();
  }
  pfStack_898 = (fdb_doc *)in_memory_snapshot_thread;
  transaction_simple_api_test();
  pfStack_8c0 = pfVar11;
  pfStack_8b8 = (fdb_doc *)pcVar15;
  pfStack_8b0 = handle;
  pfStack_8a8 = config;
  pfStack_8a0 = pfVar7;
  pfStack_898 = unaff_RBP;
  gettimeofday(&tStack_ad8,(__timezone_ptr_t)0x0);
  fVar2 = fdb_snapshot_open(pfVar12,&pfStack_ae0,0xffffffffffffffff);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdb6);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdb6,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_init(pfStack_ae0,&pfStack_af0,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdba);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdba,"void *in_memory_snapshot_thread(void *)");
  }
  uVar9 = 0;
  do {
    uVar13 = (uint)uVar9;
    pfStack_ae8 = (fdb_doc *)0x0;
    fVar2 = fdb_iterator_get(pfStack_af0,&pfStack_ae8);
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    sprintf(acStack_9c8,"key%d",uVar9);
    sprintf(acStack_ac8,"body%d",uVar9);
    pfVar8 = pfStack_ae8;
    pvVar1 = pfStack_ae8->key;
    iVar3 = bcmp(pvVar1,acStack_9c8,pfStack_ae8->keylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_9c8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc4);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc4,"void *in_memory_snapshot_thread(void *)");
    }
    pvVar1 = pfVar8->body;
    iVar3 = bcmp(pvVar1,acStack_ac8,pfVar8->bodylen);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",acStack_ac8,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xdc5);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xdc5,"void *in_memory_snapshot_thread(void *)");
    }
    uVar13 = uVar13 + 1;
    uVar9 = (ulong)uVar13;
    fdb_doc_free(pfVar8);
    fVar2 = fdb_iterator_next(pfStack_af0);
  } while (fVar2 == FDB_RESULT_SUCCESS);
  if (uVar13 != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdc9);
    __assert_fail("i == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdc9,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_iterator_close(pfStack_af0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdcc);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdcc,"void *in_memory_snapshot_thread(void *)");
  }
  fVar2 = fdb_kvs_close(pfStack_ae0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0xdce);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0xdce,"void *in_memory_snapshot_thread(void *)");
  }
  pthread_exit((void *)0x0);
}

Assistant:

void transaction_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile, *dbfile_txn1, *dbfile_txn2, *dbfile_txn3;
    fdb_kvs_handle *db, *db_txn1, *db_txn2, *db_txn3;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // open db and begin transactions
    fdb_open(&dbfile_txn1, "mvcc_test1", &fconfig);
    fdb_open(&dbfile_txn2, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn1, &db_txn1, &kvs_config);
    fdb_kvs_open_default(dbfile_txn2, &db_txn2, &kvs_config);
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // insert half docs into txn1
    for (i=0;i<n/2;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, doc[i]);
    }

    // insert other half docs into txn2
    for (i=n/2;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, doc[i]);
    }

    // uncommitted docs should not be read by the other transaction that
    // doesn't allow uncommitted reads.
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // uncommitted docs can be read by the transaction that allows uncommitted reads.
    fdb_open(&dbfile_txn3, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile_txn3, &db_txn3, &kvs_config);
    fdb_begin_transaction(dbfile_txn3, FDB_ISOLATION_READ_UNCOMMITTED);
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn3, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    fdb_end_transaction(dbfile_txn3, FDB_COMMIT_NORMAL);
    fdb_close(dbfile_txn3);

    // commit and end txn1
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);

    // uncommitted docs should not be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // read uncommitted docs using the same transaction
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // abort txn2
    fdb_abort_transaction(dbfile_txn2);

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // uncommitted docs should not be read after reopening the file either
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        if (i<n/2) {
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        } else {
            TEST_CHK(status != FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
    }

    // insert other half docs & commit
    for (i=n/2;i<n;++i){
        fdb_set(db, doc[i]);
    }
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now all docs can be read generally
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }

    // begin transactions
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    fdb_begin_transaction(dbfile_txn2, FDB_ISOLATION_READ_COMMITTED);

    // concurrently update docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_txn1", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn1, rdoc);
        fdb_doc_free(rdoc);

        sprintf(bodybuf, "body%d_txn2", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                                (void*)metabuf, strlen(metabuf),
                                (void*)bodybuf, strlen(bodybuf));
        fdb_set(db_txn2, rdoc);
        fdb_doc_free(rdoc);
    }

    // retrieve check
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn2
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn2, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn2 & retrieve check
    fdb_end_transaction(dbfile_txn2, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn2", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);

        // get from txn1
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db_txn1, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // commit txn1 & retrieve check
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    for (i=0;i<n;++i){
        // general retrieval
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        sprintf(bodybuf, "body%d_txn1", i);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // begin new transaction
    fdb_begin_transaction(dbfile_txn1, FDB_ISOLATION_READ_COMMITTED);
    // update doc#5
    i = 5;
    sprintf(keybuf, "key%d", i);
    sprintf(metabuf, "meta%d", i);
    sprintf(bodybuf, "body%d_before_compaction", i);
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf),
                            (void*)metabuf, strlen(metabuf),
                            (void*)bodybuf, strlen(bodybuf));
    fdb_set(db_txn1, rdoc);
    fdb_doc_free(rdoc);

    // do compaction
    fdb_compact(dbfile, "mvcc_test2");

    // retrieve doc#5
    // using txn1
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db_txn1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // general retrieval
    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    sprintf(bodybuf, "body%d_txn1", i);
    TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
    fdb_doc_free(rdoc);

    // commit transaction
    fdb_end_transaction(dbfile_txn1, FDB_COMMIT_NORMAL);
    // retrieve check
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close & re-open db file
    fdb_close(dbfile);
    fdb_open(&dbfile, "mvcc_test2", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "transaction_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    // retrieve check again
    for (i=0;i<n;++i){
        // general get
        sprintf(keybuf, "key%d", i);
        fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (i != 5) {
            sprintf(bodybuf, "body%d_txn1", i);
        } else {
            sprintf(bodybuf, "body%d_before_compaction", i);
        }
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        fdb_doc_free(rdoc);
    }

    // close db file
    fdb_close(dbfile);
    fdb_close(dbfile_txn1);
    fdb_close(dbfile_txn2);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("transaction test");
}